

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  libraryVersion();
  Catch::operator<<(poVar1,&libraryVersion::version);
  poVar1 = std::operator<<(poVar1,"\n");
  clara::detail::Parser::writeToStream(&this->m_cli,poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"For more detailed usage please see the project docs\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch v" << libraryVersion() << "\n"
                << m_cli << std::endl
                << "For more detailed usage please see the project docs\n" << std::endl;
    }